

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.cpp
# Opt level: O0

int mbedtls_pk_parse_key
              (mbedtls_pk_context *pk,uchar *key,size_t keylen,uchar *pwd,size_t pwdlen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_pk_context pk_00;
  mbedtls_pk_context pk_01;
  mbedtls_pk_context *in_RCX;
  long in_RDX;
  long in_RSI;
  mbedtls_pk_context *in_RDI;
  size_t *in_R8;
  size_t in_R9;
  mbedtls_pem_context pem;
  size_t len;
  mbedtls_pk_info_t *pk_info;
  int ret;
  mbedtls_pk_context *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff90;
  uchar *in_stack_ffffffffffffff98;
  uchar *in_stack_ffffffffffffffa0;
  mbedtls_rsa_context *in_stack_ffffffffffffffa8;
  mbedtls_pk_info_t *in_stack_ffffffffffffffb0;
  mbedtls_pem_context *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  int iVar1;
  
  if (in_RDX == 0) {
    return -0x3d00;
  }
  mbedtls_pem_init((mbedtls_pem_context *)0x272cc9d);
  if (*(char *)(in_RSI + in_RDX + -1) == '\0') {
    in_stack_ffffffffffffff68 = (mbedtls_pk_context *)&stack0xffffffffffffffb0;
    iVar1 = mbedtls_pem_read_buffer
                      (in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                       (char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                       in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_R8);
  }
  else {
    iVar1 = -0x1080;
  }
  if (iVar1 != 0) {
    if (iVar1 == -0x1380) {
      return -0x3b80;
    }
    if (iVar1 == -0x1300) {
      return -0x3c00;
    }
    if (iVar1 != -0x1080) {
      return iVar1;
    }
    if (*(char *)(in_RSI + in_RDX + -1) == '\0') {
      in_stack_ffffffffffffff68 = (mbedtls_pk_context *)&stack0xffffffffffffffb0;
      iVar1 = mbedtls_pem_read_buffer
                        (in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                         (char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_R8);
    }
    else {
      iVar1 = -0x1080;
    }
    if (iVar1 == 0) {
      iVar1 = pk_parse_key_pkcs8_unencrypted_der
                        (in_RCX,(uchar *)in_R8,in_R9,
                         (_func_int_void_ptr_uchar_ptr_size_t *)(ulong)in_stack_ffffffffffffffc0,
                         in_stack_ffffffffffffffb8);
      if (iVar1 != 0) {
        mbedtls_pk_free((mbedtls_pk_context *)0x272ce85);
      }
      mbedtls_pem_free((mbedtls_pem_context *)0x272ce8f);
      return iVar1;
    }
    if (iVar1 != -0x1080) {
      return iVar1;
    }
    iVar1 = pk_parse_key_pkcs8_unencrypted_der
                      (in_RCX,(uchar *)in_R8,in_R9,
                       (_func_int_void_ptr_uchar_ptr_size_t *)
                       CONCAT44(0xffffef80,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
    if (iVar1 == 0) {
      return 0;
    }
    mbedtls_pk_free((mbedtls_pk_context *)0x272cf0a);
    mbedtls_pk_init(in_RDI);
    mbedtls_pk_info_from_type(MBEDTLS_PK_RSA);
    iVar1 = mbedtls_pk_setup(in_stack_ffffffffffffff68,(mbedtls_pk_info_t *)0x272cf38);
    if (iVar1 == 0) {
      pk_01.pk_ctx = in_stack_ffffffffffffff68;
      pk_01.pk_info = (mbedtls_pk_info_t *)0x272cf65;
      mbedtls_pk_rsa(pk_01);
      iVar1 = mbedtls_rsa_parse_key
                        (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                         (size_t)in_stack_ffffffffffffff98);
      if (iVar1 == 0) {
        return 0;
      }
    }
    mbedtls_pk_free((mbedtls_pk_context *)0x272cf99);
    mbedtls_pk_init(in_RDI);
    return -0x3d00;
  }
  mbedtls_pk_info_from_type(MBEDTLS_PK_RSA);
  iVar1 = mbedtls_pk_setup(in_stack_ffffffffffffff68,(mbedtls_pk_info_t *)0x272cd24);
  if (iVar1 == 0) {
    pk_00.pk_ctx = in_stack_ffffffffffffff68;
    pk_00.pk_info = (mbedtls_pk_info_t *)0x272cd55;
    mbedtls_pk_rsa(pk_00);
    iVar1 = mbedtls_rsa_parse_key
                      (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                       (size_t)in_stack_ffffffffffffff98);
    if (iVar1 == 0) goto LAB_0272cd7d;
  }
  mbedtls_pk_free((mbedtls_pk_context *)0x272cd7d);
LAB_0272cd7d:
  mbedtls_pem_free((mbedtls_pem_context *)0x272cd87);
  return iVar1;
}

Assistant:

int mbedtls_pk_parse_key(mbedtls_pk_context *pk,
                         const unsigned char *key, size_t keylen,
                         const unsigned char *pwd, size_t pwdlen,
                         int (*f_rng)(void *, unsigned char *, size_t), void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const mbedtls_pk_info_t *pk_info;
#if defined(MBEDTLS_PEM_PARSE_C)
    size_t len;
    mbedtls_pem_context pem;
#endif

    if (keylen == 0) {
        return MBEDTLS_ERR_PK_KEY_INVALID_FORMAT;
    }

#if defined(MBEDTLS_PEM_PARSE_C)
    mbedtls_pem_init(&pem);

#if defined(MBEDTLS_RSA_C)
    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if (key[keylen - 1] != '\0') {
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    } else {
        ret = mbedtls_pem_read_buffer(&pem,
                                      PEM_BEGIN_PRIVATE_KEY_RSA, PEM_END_PRIVATE_KEY_RSA,
                                      key, pwd, pwdlen, &len);
    }

    if (ret == 0) {
        pk_info = mbedtls_pk_info_from_type(MBEDTLS_PK_RSA);
        if ((ret = mbedtls_pk_setup(pk, pk_info)) != 0 ||
            (ret = mbedtls_rsa_parse_key(mbedtls_pk_rsa(*pk),
                                         pem.buf, pem.buflen)) != 0) {
            mbedtls_pk_free(pk);
        }

        mbedtls_pem_free(&pem);
        return ret;
    } else if (ret == MBEDTLS_ERR_PEM_PASSWORD_MISMATCH) {
        return MBEDTLS_ERR_PK_PASSWORD_MISMATCH;
    } else if (ret == MBEDTLS_ERR_PEM_PASSWORD_REQUIRED) {
        return MBEDTLS_ERR_PK_PASSWORD_REQUIRED;
    } else if (ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT) {
        return ret;
    }
#endif /* MBEDTLS_RSA_C */

#if defined(MBEDTLS_PK_HAVE_ECC_KEYS)
    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if (key[keylen - 1] != '\0') {
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    } else {
        ret = mbedtls_pem_read_buffer(&pem,
                                      PEM_BEGIN_PRIVATE_KEY_EC,
                                      PEM_END_PRIVATE_KEY_EC,
                                      key, pwd, pwdlen, &len);
    }
    if (ret == 0) {
        pk_info = mbedtls_pk_info_from_type(MBEDTLS_PK_ECKEY);

        if ((ret = mbedtls_pk_setup(pk, pk_info)) != 0 ||
            (ret = pk_parse_key_sec1_der(pk,
                                         pem.buf, pem.buflen,
                                         f_rng, p_rng)) != 0) {
            mbedtls_pk_free(pk);
        }

        mbedtls_pem_free(&pem);
        return ret;
    } else if (ret == MBEDTLS_ERR_PEM_PASSWORD_MISMATCH) {
        return MBEDTLS_ERR_PK_PASSWORD_MISMATCH;
    } else if (ret == MBEDTLS_ERR_PEM_PASSWORD_REQUIRED) {
        return MBEDTLS_ERR_PK_PASSWORD_REQUIRED;
    } else if (ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT) {
        return ret;
    }
#endif /* MBEDTLS_PK_HAVE_ECC_KEYS */

    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if (key[keylen - 1] != '\0') {
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    } else {
        ret = mbedtls_pem_read_buffer(&pem,
                                      PEM_BEGIN_PRIVATE_KEY_PKCS8, PEM_END_PRIVATE_KEY_PKCS8,
                                      key, NULL, 0, &len);
    }
    if (ret == 0) {
        if ((ret = pk_parse_key_pkcs8_unencrypted_der(pk,
                                                      pem.buf, pem.buflen, f_rng, p_rng)) != 0) {
            mbedtls_pk_free(pk);
        }

        mbedtls_pem_free(&pem);
        return ret;
    } else if (ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT) {
        return ret;
    }

#if defined(MBEDTLS_PKCS12_C) || defined(MBEDTLS_PKCS5_C)
    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if (key[keylen - 1] != '\0') {
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    } else {
        ret = mbedtls_pem_read_buffer(&pem,
                                      PEM_BEGIN_ENCRYPTED_PRIVATE_KEY_PKCS8,
                                      PEM_END_ENCRYPTED_PRIVATE_KEY_PKCS8,
                                      key, NULL, 0, &len);
    }
    if (ret == 0) {
        if ((ret = mbedtls_pk_parse_key_pkcs8_encrypted_der(pk, pem.buf, pem.buflen,
                                                            pwd, pwdlen, f_rng, p_rng)) != 0) {
            mbedtls_pk_free(pk);
        }

        mbedtls_pem_free(&pem);
        return ret;
    } else if (ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT) {
        return ret;
    }
#endif /* MBEDTLS_PKCS12_C || MBEDTLS_PKCS5_C */
#else
    ((void) pwd);
    ((void) pwdlen);
#endif /* MBEDTLS_PEM_PARSE_C */

    /*
     * At this point we only know it's not a PEM formatted key. Could be any
     * of the known DER encoded private key formats
     *
     * We try the different DER format parsers to see if one passes without
     * error
     */
#if defined(MBEDTLS_PKCS12_C) || defined(MBEDTLS_PKCS5_C)
    if (pwdlen != 0) {
        unsigned char *key_copy;

        if ((key_copy = mbedtls_calloc(1, keylen)) == NULL) {
            return MBEDTLS_ERR_PK_ALLOC_FAILED;
        }

        memcpy(key_copy, key, keylen);

        ret = mbedtls_pk_parse_key_pkcs8_encrypted_der(pk, key_copy, keylen,
                                                       pwd, pwdlen, f_rng, p_rng);

        mbedtls_zeroize_and_free(key_copy, keylen);
    }

    if (ret == 0) {
        return 0;
    }

    mbedtls_pk_free(pk);
    mbedtls_pk_init(pk);

    if (ret == MBEDTLS_ERR_PK_PASSWORD_MISMATCH) {
        return ret;
    }
#endif /* MBEDTLS_PKCS12_C || MBEDTLS_PKCS5_C */

    ret = pk_parse_key_pkcs8_unencrypted_der(pk, key, keylen, f_rng, p_rng);
    if (ret == 0) {
        return 0;
    }

    mbedtls_pk_free(pk);
    mbedtls_pk_init(pk);

#if defined(MBEDTLS_RSA_C)

    pk_info = mbedtls_pk_info_from_type(MBEDTLS_PK_RSA);
    if (mbedtls_pk_setup(pk, pk_info) == 0 &&
        mbedtls_rsa_parse_key(mbedtls_pk_rsa(*pk), key, keylen) == 0) {
        return 0;
    }

    mbedtls_pk_free(pk);
    mbedtls_pk_init(pk);
#endif /* MBEDTLS_RSA_C */

#if defined(MBEDTLS_PK_HAVE_ECC_KEYS)
    pk_info = mbedtls_pk_info_from_type(MBEDTLS_PK_ECKEY);
    if (mbedtls_pk_setup(pk, pk_info) == 0 &&
        pk_parse_key_sec1_der(pk,
                              key, keylen, f_rng, p_rng) == 0) {
        return 0;
    }
    mbedtls_pk_free(pk);
#endif /* MBEDTLS_PK_HAVE_ECC_KEYS */

    /* If MBEDTLS_RSA_C is defined but MBEDTLS_PK_HAVE_ECC_KEYS isn't,
     * it is ok to leave the PK context initialized but not
     * freed: It is the caller's responsibility to call pk_init()
     * before calling this function, and to call pk_free()
     * when it fails. If MBEDTLS_PK_HAVE_ECC_KEYS is defined but MBEDTLS_RSA_C
     * isn't, this leads to mbedtls_pk_free() being called
     * twice, once here and once by the caller, but this is
     * also ok and in line with the mbedtls_pk_free() calls
     * on failed PEM parsing attempts. */

    return MBEDTLS_ERR_PK_KEY_INVALID_FORMAT;
}